

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForStatement.h
# Opt level: O1

void __thiscall ForStatement::execute(ForStatement *this,Environment *env)

{
  Identifier *ident;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  undefined8 *puVar2;
  runtime_error *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  ulong uVar3;
  ptr<Value> expressionResult;
  Environment local;
  ptr<Value> local_a8;
  ForStatement *local_98;
  Environment *local_90;
  long *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_98 = this;
  local_90 = env;
  (**((this->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_Expression)(&local_78);
  if (local_78 == 0) {
    puVar2 = (undefined8 *)0x0;
  }
  else {
    puVar2 = (undefined8 *)
             __dynamic_cast(local_78,&Value::typeinfo,&Iterable::typeinfo,0xfffffffffffffffe);
  }
  if (puVar2 == (undefined8 *)0x0) {
    this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    puVar2 = (undefined8 *)0x0;
  }
  else {
    this_02 = local_70;
    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_70->_M_use_count = local_70->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_70->_M_use_count = local_70->_M_use_count + 1;
      }
    }
  }
  if (puVar2 == (undefined8 *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Given value is not an iterable");
    *(undefined ***)this_01 = &PTR__runtime_error_0012ed28;
    __cxa_throw(this_01,&RuntimeException::typeinfo,std::runtime_error::~runtime_error);
  }
  (**(code **)*puVar2)(&local_88);
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_80->_M_use_count = local_80->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_80->_M_use_count = local_80->_M_use_count + 1;
    }
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_88[1] != *local_88) {
    ident = &local_98->ident;
    uVar3 = 0;
    do {
      Environment::Environment((Environment *)&local_68,local_90);
      local_a8.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(*local_88 + uVar3 * 0x10);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*local_88 + 8 + uVar3 * 0x10);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
      }
      uVar3 = uVar3 + 1;
      local_a8.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
      Environment::putValue((Environment *)&local_68,ident,Public,&local_a8,false);
      if (local_a8.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      peVar1 = (local_98->statementBlock).
               super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (**(peVar1->super_Statement)._vptr_Statement)(peVar1,&local_68);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      std::
      _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
    } while (uVar3 < (ulong)(local_88[1] - *local_88 >> 4));
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  return;
}

Assistant:

void execute(Environment *env) override {
        ptr<Value> expressionResult = expression->evaluate(env);
        ptr<Iterable> iterable = std::dynamic_pointer_cast<Iterable>(expressionResult);

        if(!iterable)
            throw RuntimeException("Given value is not an iterable");

        Iterator iterator(iterable -> getValues());

        while(iterator.hasNext()) {
            try {
                Environment local = *env;
                ptr<Value> newValue = iterator.next();
                local.putValue(ident, Scope::Public, newValue, false);
                statementBlock -> execute(&local);
            } catch (BreakPacket&) {
                break;
            } catch (ContinuePacket&) { }
        }
    }